

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerMSL::MemberSorter::sort(MemberSorter *this)

{
  size_t new_size;
  size_t new_size_00;
  uint *puVar1;
  bool bVar2;
  undefined8 uVar3;
  _Iter_comp_iter<spirv_cross::CompilerMSL::MemberSorter> __comp;
  _Iter_comp_iter<spirv_cross::CompilerMSL::MemberSorter> __comp_00;
  long lVar4;
  char *pcVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  BuiltIn BVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint *__buffer;
  long lVar18;
  long lVar19;
  ulong uVar20;
  uint32_t *puVar21;
  uint32_t *puVar22;
  Decoration *pDVar23;
  ulong uVar24;
  Decoration *pDVar25;
  byte bVar26;
  pair<unsigned_int_*,_long> pVar27;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> mbr_types_cpy;
  SmallVector<unsigned_int,_8UL> mbr_idxs;
  Vector<Decoration> mbr_meta_cpy;
  undefined1 local_d8 [64];
  SmallVector<unsigned_int,_8UL> local_98;
  SmallVector<spirv_cross::Meta::Decoration,_0UL> local_58;
  
  bVar26 = 0;
  new_size = (this->type->member_types).
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
  local_98.super_VectorView<unsigned_int>.ptr = (uint *)&local_98.stack_storage;
  local_98.super_VectorView<unsigned_int>.buffer_size = 0;
  local_98.buffer_capacity = 8;
  SmallVector<unsigned_int,_8UL>::resize(&local_98,new_size);
  puVar1 = local_98.super_VectorView<unsigned_int>.ptr;
  if (local_98.super_VectorView<unsigned_int>.buffer_size == 0) {
    local_d8._16_8_ = *(undefined8 *)&this->sort_aspect;
    local_d8._0_8_ = this->type;
    local_d8._8_8_ = this->meta;
  }
  else {
    lVar4 = local_98.super_VectorView<unsigned_int>.buffer_size * 4;
    pcVar5 = (char *)local_98.super_VectorView<unsigned_int>.ptr;
    lVar18 = local_98.super_VectorView<unsigned_int>.buffer_size * 4;
    lVar19 = 0;
    do {
      *(int *)((char *)local_98.super_VectorView<unsigned_int>.ptr + lVar19 * 4) = (int)lVar19;
      lVar19 = lVar19 + 1;
      lVar18 = lVar18 + -4;
    } while (lVar18 != 0);
    local_d8._16_8_ = *(undefined8 *)&this->sort_aspect;
    local_d8._0_8_ = this->type;
    local_d8._8_8_ = this->meta;
    if (local_98.super_VectorView<unsigned_int>.buffer_size != 0) {
      pVar27 = ::std::get_temporary_buffer<unsigned_int>
                         ((long)((local_98.super_VectorView<unsigned_int>.buffer_size -
                                 ((long)(local_98.super_VectorView<unsigned_int>.buffer_size + 1) >>
                                 0x3f)) + 1) >> 1);
      __buffer = pVar27.first;
      if (__buffer == (uint *)0x0) {
        __comp_00._M_comp.meta = (Meta *)local_d8._8_8_;
        __comp_00._M_comp.type = (SPIRType *)local_d8._0_8_;
        __comp_00._M_comp._16_8_ = local_d8._16_8_;
        ::std::
        __inplace_stable_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::MemberSorter>>
                  (puVar1,(uint *)(pcVar5 + lVar4),__comp_00);
      }
      else {
        __comp._M_comp.meta = (Meta *)local_d8._8_8_;
        __comp._M_comp.type = (SPIRType *)local_d8._0_8_;
        __comp._M_comp._16_8_ = local_d8._16_8_;
        ::std::
        __stable_sort_adaptive<unsigned_int*,unsigned_int*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::MemberSorter>>
                  (puVar1,(uint *)(pcVar5 + lVar4),__buffer,pVar27.second,__comp);
      }
      operator_delete(__buffer);
    }
  }
  if (new_size != 0) {
    uVar20 = 0;
    do {
      if ((int)uVar20 != *(int *)((char *)local_98.super_VectorView<unsigned_int>.ptr + uVar20 * 4))
      {
        new_size_00 = (this->type->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
        if ((this->meta->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size <
            new_size_00) {
          SmallVector<spirv_cross::Meta::Decoration,_0UL>::resize(&this->meta->members,new_size_00);
        }
        local_d8._0_8_ = local_d8 + 0x18;
        local_d8._8_8_ = 0;
        local_d8._16_8_ = 8;
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)local_d8,
                   &this->type->member_types);
        local_58.super_VectorView<spirv_cross::Meta::Decoration>.ptr = (Decoration *)0x0;
        local_58.super_VectorView<spirv_cross::Meta::Decoration>.buffer_size = 0;
        local_58.buffer_capacity = 0;
        SmallVector<spirv_cross::Meta::Decoration,_0UL>::operator=(&local_58,&this->meta->members);
        uVar20 = 0;
        uVar24 = 1;
        do {
          (this->type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          ptr[uVar20].id =
               *(uint32_t *)
                ((((SmallVector<unsigned_int,_8UL> *)(local_d8._0_8_ + 0x20))->stack_storage).
                 aligned_char +
                (ulong)*(uint *)((char *)local_98.super_VectorView<unsigned_int>.ptr + uVar20 * 4) *
                4 + -0x38);
          pDVar25 = local_58.super_VectorView<spirv_cross::Meta::Decoration>.ptr +
                    *(uint *)((char *)local_98.super_VectorView<unsigned_int>.ptr + uVar20 * 4);
          pDVar23 = (this->meta->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr +
                    uVar20;
          ::std::__cxx11::string::_M_assign((string *)pDVar23);
          ::std::__cxx11::string::_M_assign((string *)&pDVar23->qualified_alias);
          ::std::__cxx11::string::_M_assign((string *)&pDVar23->hlsl_semantic);
          ::std::__cxx11::string::_M_assign((string *)&pDVar23->user_type);
          (pDVar23->decoration_flags).lower = (pDVar25->decoration_flags).lower;
          if (pDVar25 == pDVar23) {
            BVar14 = pDVar25->builtin_type;
            uVar15 = pDVar25->location;
            uVar16 = pDVar25->component;
            uVar17 = pDVar25->set;
            uVar10 = pDVar25->binding;
            uVar11 = pDVar25->offset;
            uVar12 = pDVar25->xfb_buffer;
            uVar13 = pDVar25->xfb_stride;
            uVar6 = pDVar25->stream;
            uVar7 = pDVar25->array_stride;
            uVar8 = pDVar25->matrix_stride;
            uVar9 = pDVar25->input_attachment;
            uVar3 = *(undefined8 *)((long)&pDVar25->index + 2);
            *(undefined8 *)((long)&pDVar23->input_attachment + 2) =
                 *(undefined8 *)((long)&pDVar25->input_attachment + 2);
            *(undefined8 *)((long)&pDVar23->index + 2) = uVar3;
            pDVar23->stream = uVar6;
            pDVar23->array_stride = uVar7;
            pDVar23->matrix_stride = uVar8;
            pDVar23->input_attachment = uVar9;
            pDVar23->binding = uVar10;
            pDVar23->offset = uVar11;
            pDVar23->xfb_buffer = uVar12;
            pDVar23->xfb_stride = uVar13;
            pDVar23->builtin_type = BVar14;
            pDVar23->location = uVar15;
            pDVar23->component = uVar16;
            pDVar23->set = uVar17;
            (pDVar23->extended).flags.lower = (pDVar25->extended).flags.lower;
          }
          else {
            ::std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&(pDVar23->decoration_flags).higher,
                       &(pDVar25->decoration_flags).higher._M_h);
            BVar14 = pDVar25->builtin_type;
            uVar15 = pDVar25->location;
            uVar16 = pDVar25->component;
            uVar17 = pDVar25->set;
            uVar10 = pDVar25->binding;
            uVar11 = pDVar25->offset;
            uVar12 = pDVar25->xfb_buffer;
            uVar13 = pDVar25->xfb_stride;
            uVar6 = pDVar25->stream;
            uVar7 = pDVar25->array_stride;
            uVar8 = pDVar25->matrix_stride;
            uVar9 = pDVar25->input_attachment;
            uVar3 = *(undefined8 *)((long)&pDVar25->index + 2);
            *(undefined8 *)((long)&pDVar23->input_attachment + 2) =
                 *(undefined8 *)((long)&pDVar25->input_attachment + 2);
            *(undefined8 *)((long)&pDVar23->index + 2) = uVar3;
            pDVar23->stream = uVar6;
            pDVar23->array_stride = uVar7;
            pDVar23->matrix_stride = uVar8;
            pDVar23->input_attachment = uVar9;
            pDVar23->binding = uVar10;
            pDVar23->offset = uVar11;
            pDVar23->xfb_buffer = uVar12;
            pDVar23->xfb_stride = uVar13;
            pDVar23->builtin_type = BVar14;
            pDVar23->location = uVar15;
            pDVar23->component = uVar16;
            pDVar23->set = uVar17;
            (pDVar23->extended).flags.lower = (pDVar25->extended).flags.lower;
            if (pDVar25 != pDVar23) {
              ::std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)&(pDVar23->extended).flags.higher,&(pDVar25->extended).flags.higher._M_h
                        );
            }
          }
          puVar21 = (pDVar25->extended).values;
          puVar22 = (pDVar23->extended).values;
          for (lVar18 = 9; lVar18 != 0; lVar18 = lVar18 + -1) {
            *(undefined8 *)puVar22 = *(undefined8 *)puVar21;
            puVar21 = puVar21 + (ulong)bVar26 * -4 + 2;
            puVar22 = puVar22 + (ulong)bVar26 * -4 + 2;
          }
          bVar2 = uVar24 < new_size;
          uVar20 = uVar24;
          uVar24 = (ulong)((int)uVar24 + 1);
        } while (bVar2);
        if (this->sort_aspect == Offset) {
          SmallVector<unsigned_int,_8UL>::resize
                    (&this->type->member_type_index_redirection,new_size);
          puVar1 = (this->type->member_type_index_redirection).super_VectorView<unsigned_int>.ptr;
          uVar20 = 0;
          do {
            puVar1[*(uint *)((char *)local_98.super_VectorView<unsigned_int>.ptr + uVar20 * 4)] =
                 (uint)uVar20;
            uVar20 = uVar20 + 1;
          } while ((uVar20 & 0xffffffff) < new_size);
        }
        SmallVector<spirv_cross::Meta::Decoration,_0UL>::~SmallVector(&local_58);
        local_d8._8_8_ = (Meta *)0x0;
        if ((SPIRType *)local_d8._0_8_ != (SPIRType *)(local_d8 + 0x18)) {
          free((void *)local_d8._0_8_);
        }
        break;
      }
      uVar20 = (ulong)((int)uVar20 + 1);
    } while (uVar20 < new_size);
  }
  local_98.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)local_98.super_VectorView<unsigned_int>.ptr !=
      &local_98.stack_storage) {
    free(local_98.super_VectorView<unsigned_int>.ptr);
  }
  return;
}

Assistant:

void CompilerMSL::MemberSorter::sort()
{
	// Create a temporary array of consecutive member indices and sort it based on how
	// the members should be reordered, based on builtin and sorting aspect meta info.
	size_t mbr_cnt = type.member_types.size();
	SmallVector<uint32_t> mbr_idxs(mbr_cnt);
	std::iota(mbr_idxs.begin(), mbr_idxs.end(), 0); // Fill with consecutive indices
	std::stable_sort(mbr_idxs.begin(), mbr_idxs.end(), *this); // Sort member indices based on sorting aspect

	bool sort_is_identity = true;
	for (uint32_t mbr_idx = 0; mbr_idx < mbr_cnt; mbr_idx++)
	{
		if (mbr_idx != mbr_idxs[mbr_idx])
		{
			sort_is_identity = false;
			break;
		}
	}

	if (sort_is_identity)
		return;

	if (meta.members.size() < type.member_types.size())
	{
		// This should never trigger in normal circumstances, but to be safe.
		meta.members.resize(type.member_types.size());
	}

	// Move type and meta member info to the order defined by the sorted member indices.
	// This is done by creating temporary copies of both member types and meta, and then
	// copying back to the original content at the sorted indices.
	auto mbr_types_cpy = type.member_types;
	auto mbr_meta_cpy = meta.members;
	for (uint32_t mbr_idx = 0; mbr_idx < mbr_cnt; mbr_idx++)
	{
		type.member_types[mbr_idx] = mbr_types_cpy[mbr_idxs[mbr_idx]];
		meta.members[mbr_idx] = mbr_meta_cpy[mbr_idxs[mbr_idx]];
	}

	// If we're sorting by Offset, this might affect user code which accesses a buffer block.
	// We will need to redirect member indices from defined index to sorted index using reverse lookup.
	if (sort_aspect == SortAspect::Offset)
	{
		type.member_type_index_redirection.resize(mbr_cnt);
		for (uint32_t map_idx = 0; map_idx < mbr_cnt; map_idx++)
			type.member_type_index_redirection[mbr_idxs[map_idx]] = map_idx;
	}
}